

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtypes.c
# Opt level: O1

int StringToInt(tchar_t *In,int Hex)

{
  char *Mask;
  bool bVar1;
  int v;
  char *local_18;
  int local_c;
  
  local_c = 0;
  local_18 = In;
  if (Hex < 0) {
    ExprSkipSpace(&local_18);
    if (*local_18 == '0') {
      bVar1 = local_18[1] == 'x';
    }
    else {
      bVar1 = false;
    }
    Hex = (uint)bVar1;
    if (bVar1 != false) {
      local_18 = local_18 + 2;
      Hex = (uint)bVar1;
    }
  }
  Mask = "%X";
  if (Hex == 0) {
    Mask = "%d";
  }
  stscanf(local_18,Mask,&local_c);
  return local_c;
}

Assistant:

int StringToInt(const tchar_t* In, int Hex)
{
    int v=0;
    if (Hex<0)
    {
        ExprSkipSpace(&In);
        Hex = In[0]=='0' && In[1]=='x';
        if (Hex) In+=2;
    }
    stscanf(In,Hex ? T("%X"):T("%d"),&v);
    return v;
}